

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

void __thiscall
ws::Record::add<std::__cxx11::string>
          (Record *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_local;
  Record *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->message,data);
  return;
}

Assistant:

void add(T &&data)
    {
      using DataType = std::remove_cvref_t<T>;
      if constexpr (std::is_same_v<char, DataType>)
      {
        message += data;
      }
      else if constexpr (std::is_same_v<DataType, std::string>)
      {
        message += data;
      }
      else if constexpr (std::is_same_v<std::decay_t<DataType>, const char *>
                         || std::is_same_v<std::decay_t<DataType>, char *>
          )
      {
        message += data;
      }
      else
      {
        message += std::to_string(data);
      }
    }